

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteDataInitializerDecls(CWriter *this)

{
  bool bVar1;
  vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_> *this_00;
  reference ppDVar2;
  size_type sVar3;
  Newline local_49;
  GlobalName local_48;
  Newline local_31;
  DataSegment *local_30;
  DataSegment *data_segment;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_> *__range2;
  CWriter *this_local;
  
  bVar1 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::empty
                    (&this->module_->memories);
  if (!bVar1) {
    this_00 = &this->module_->data_segments;
    __end2 = std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>::begin(this_00);
    data_segment = (DataSegment *)
                   std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>::end
                             (this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<wabt::DataSegment_*const_*,_std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>_>
                                       *)&data_segment), bVar1) {
      ppDVar2 = __gnu_cxx::
                __normal_iterator<wabt::DataSegment_*const_*,_std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>_>
                ::operator*(&__end2);
      local_30 = *ppDVar2;
      bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&local_30->data);
      if ((!bVar1) &&
         (sVar3 = std::vector<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>::size
                            (&this->c_streams_), 1 < sVar3)) {
        GlobalName::GlobalName(&local_48,DataSegment,&local_30->name);
        (anonymous_namespace)::CWriter::
        Write<wabt::(anonymous_namespace)::Newline,char_const(&)[35],wabt::(anonymous_namespace)::GlobalName,char_const(&)[4],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,&local_31,(char (*) [35])"extern const u8 data_segment_data_",
                   &local_48,(char (*) [4])"[];",&local_49);
      }
      __gnu_cxx::
      __normal_iterator<wabt::DataSegment_*const_*,_std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void CWriter::WriteDataInitializerDecls() {
  if (module_->memories.empty()) {
    return;
  }

  for (const DataSegment* data_segment : module_->data_segments) {
    if (data_segment->data.empty()) {
      continue;
    }

    if (c_streams_.size() > 1) {
      Write(Newline(), "extern const u8 data_segment_data_",
            GlobalName(ModuleFieldType::DataSegment, data_segment->name), "[];",
            Newline());
    }
  }
}